

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack_unpack.c
# Opt level: O0

void next_token(scanner_t *s)

{
  int iVar1;
  undefined7 uVar2;
  bool bVar3;
  char *local_18;
  char *t;
  scanner_t *s_local;
  
  iVar1 = (s->token).column;
  (s->prev_token).line = (s->token).line;
  (s->prev_token).column = iVar1;
  (s->prev_token).pos = (s->token).pos;
  uVar2 = *(undefined7 *)&(s->token).field_0x11;
  (s->prev_token).token = (s->token).token;
  *(undefined7 *)&(s->prev_token).field_0x11 = uVar2;
  if ((s->next_token).line == 0) {
    if (((s->token).token != '\0') || (*s->fmt != '\0')) {
      local_18 = s->fmt;
      s->column = s->column + 1;
      s->pos = s->pos + 1;
      while( true ) {
        bVar3 = true;
        if ((((*local_18 != ' ') && (bVar3 = true, *local_18 != '\t')) &&
            (bVar3 = true, *local_18 != '\n')) && (bVar3 = true, *local_18 != ',')) {
          bVar3 = *local_18 == ':';
        }
        if (!bVar3) break;
        if (*local_18 == '\n') {
          s->line = s->line + 1;
          s->column = 1;
        }
        else {
          s->column = s->column + 1;
        }
        s->pos = s->pos + 1;
        local_18 = local_18 + 1;
      }
      (s->token).token = *local_18;
      (s->token).line = s->line;
      (s->token).column = s->column;
      (s->token).pos = s->pos;
      if (*local_18 != '\0') {
        local_18 = local_18 + 1;
      }
      s->fmt = local_18;
    }
  }
  else {
    iVar1 = (s->next_token).column;
    (s->token).line = (s->next_token).line;
    (s->token).column = iVar1;
    (s->token).pos = (s->next_token).pos;
    uVar2 = *(undefined7 *)&(s->next_token).field_0x11;
    (s->token).token = (s->next_token).token;
    *(undefined7 *)&(s->token).field_0x11 = uVar2;
    (s->next_token).line = 0;
  }
  return;
}

Assistant:

static void next_token(scanner_t *s) {
    const char *t;
    s->prev_token = s->token;

    if (s->next_token.line) {
        s->token = s->next_token;
        s->next_token.line = 0;
        return;
    }

    if (!token(s) && !*s->fmt)
        return;

    t = s->fmt;
    s->column++;
    s->pos++;

    /* skip space and ignored chars */
    while (*t == ' ' || *t == '\t' || *t == '\n' || *t == ',' || *t == ':') {
        if (*t == '\n') {
            s->line++;
            s->column = 1;
        } else
            s->column++;

        s->pos++;
        t++;
    }

    s->token.token = *t;
    s->token.line = s->line;
    s->token.column = s->column;
    s->token.pos = s->pos;

    if (*t)
        t++;
    s->fmt = t;
}